

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O1

void __thiscall dummy_api::~dummy_api(dummy_api *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__dummy_api_00117a78;
  pcVar1 = (this->headers_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->headers_).field_2) {
    operator_delete(pcVar1);
  }
  cppcms::impl::cgi::connection::~connection(&this->super_connection);
  operator_delete(this);
  return;
}

Assistant:

dummy_api(cppcms::service &srv,std::map<std::string,std::string> env,std::string &output,bool mark_chunks=false,bool write_eof=false) :
		cppcms::impl::cgi::connection(srv),
		output_(&output),
		write_eof_(write_eof),
		mark_chunks_(mark_chunks),
		headers_written_(false)
	{
		for(std::map<std::string,std::string>::iterator p=env.begin();p!=env.end();++p)
			env_.add(pool_.add(p->first),pool_.add(p->second));

	}